

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

void share_dead_xchannel_respond(ssh_sharing_connstate *cs,share_xchannel *xc)

{
  share_xchannel_message *ptr;
  ConnectionLayer *pCVar1;
  _Bool _Var2;
  strbuf *buf_o;
  bool bVar3;
  share_xchannel_message *msg;
  BinarySource src [1];
  
  bVar3 = false;
  while (ptr = xc->msghead, ptr != (share_xchannel_message *)0x0) {
    xc->msghead = ptr->next;
    if ((ptr->type == 0x62) && (4 < (long)ptr->datalen)) {
      src[0].data = ptr->data;
      src[0].pos = 0;
      src[0].err = BSE_NO_ERROR;
      src[0].len = (long)ptr->datalen;
      src[0].binarysource_ = src;
      BinarySource_get_uint32(src);
      BinarySource_get_string(src[0].binarysource_);
      _Var2 = BinarySource_get_bool(src[0].binarysource_);
      if (_Var2) {
        buf_o = strbuf_new();
        BinarySink_put_uint32(buf_o->binarysink_,(ulong)xc->server_id);
        pCVar1 = cs->parent->cl;
        (*pCVar1->vt->send_packet_from_downstream)
                  (pCVar1,cs->id,100,buf_o->s,(int)buf_o->len,"downstream refused X channel open");
        strbuf_free(buf_o);
      }
    }
    else {
      bVar3 = (bool)(bVar3 | ptr->type == 0x61);
    }
    safefree(ptr);
  }
  xc->msgtail = (share_xchannel_message *)0x0;
  if (bVar3) {
    pCVar1 = cs->parent->cl;
    (*pCVar1->vt->delete_sharing_channel)(pCVar1,xc->upstream_id);
    share_remove_xchannel(cs,xc);
  }
  return;
}

Assistant:

void share_dead_xchannel_respond(struct ssh_sharing_connstate *cs,
                                 struct share_xchannel *xc)
{
    /*
     * Handle queued incoming messages from the server destined for an
     * xchannel which is dead (i.e. downstream sent OPEN_FAILURE).
     */
    bool delete = false;
    while (xc->msghead) {
        struct share_xchannel_message *msg = xc->msghead;
        xc->msghead = msg->next;

        if (msg->type == SSH2_MSG_CHANNEL_REQUEST && msg->datalen > 4) {
            /*
             * A CHANNEL_REQUEST is responded to by sending
             * CHANNEL_FAILURE, if it has want_reply set.
             */
            BinarySource src[1];
            BinarySource_BARE_INIT(src, msg->data, msg->datalen);
            get_uint32(src);           /* skip channel id */
            get_string(src);           /* skip request type */
            if (get_bool(src)) {
                strbuf *packet = strbuf_new();
                put_uint32(packet, xc->server_id);
                ssh_send_packet_from_downstream
                    (cs->parent->cl, cs->id, SSH2_MSG_CHANNEL_FAILURE,
                     packet->s, packet->len,
                     "downstream refused X channel open");
                strbuf_free(packet);
            }
        } else if (msg->type == SSH2_MSG_CHANNEL_CLOSE) {
            /*
             * On CHANNEL_CLOSE we can discard the channel completely.
             */
            delete = true;
        }

        sfree(msg);
    }
    xc->msgtail = NULL;
    if (delete) {
        ssh_delete_sharing_channel(cs->parent->cl, xc->upstream_id);
        share_remove_xchannel(cs, xc);
    }
}